

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O2

void __thiscall
cinject::ComponentBuilderBase<IWalker,ICrawler,ISwimmer,IWaterConsumer,Turtle>::
registerType<Turtle,cinject::InstanceStorage<Turtle,cinject::ConstructorFactory<Turtle,void>>,IWalker,ICrawler,ISwimmer,IWaterConsumer,Turtle>
          (ComponentBuilderBase<IWalker,ICrawler,ISwimmer,IWaterConsumer,Turtle> *this,
          shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
          *instanceStorage)

{
  __shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  __shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  std::
  __shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_30,
                 &instanceStorage->
                  super___shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  addRegistration<Turtle,cinject::InstanceStorage<Turtle,cinject::ConstructorFactory<Turtle,void>>,IWalker>
            (this,(shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
                   *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::
  __shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_40,
                 &instanceStorage->
                  super___shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  registerType<Turtle,cinject::InstanceStorage<Turtle,cinject::ConstructorFactory<Turtle,void>>,ICrawler,ISwimmer,IWaterConsumer,Turtle>
            (this,(shared_ptr<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
                   *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void registerType(std::shared_ptr<TInstanceStorage> instanceStorage)
    {
        // register
        addRegistration<TImplementation, TInstanceStorage, TComponent1>(instanceStorage);


        registerType<TImplementation, TInstanceStorage, TComponentOther, TRest...>(instanceStorage);
    }